

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,object_literal_expression *e)

{
  pointer ppVar1;
  long *plVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  std::operator<<(this->os_,'{');
  lVar5 = 0;
  uVar6 = 0;
  do {
    ppVar1 = (e->elements_).
             super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(e->elements_).
                       super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x18) <= uVar6)
    {
      std::operator<<(this->os_,'}');
      return;
    }
    if (*(int *)((long)&ppVar1->type_ + lVar5) == 0) {
      pcVar4 = "], ";
      if (uVar6 == 0) {
        pcVar4 = "\t";
      }
      std::operator<<(this->os_,pcVar4 + 1);
      accept<mjs::print_visitor>
                (*(expression **)
                  ((long)&(((e->elements_).
                            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                            ._M_impl.super__Vector_impl_data._M_start)->name_)._M_t.
                          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                  + lVar5),this);
      std::operator<<(this->os_,": ");
      accept<mjs::print_visitor>
                (*(expression **)
                  ((long)&(((e->elements_).
                            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                            ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                  + lVar5),this);
    }
    else {
      pcVar4 = ",";
      if (uVar6 == 0) {
        pcVar4 = "";
      }
      std::operator<<(this->os_,pcVar4);
      plVar2 = *(long **)((long)&(((e->elements_).
                                   super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                         + lVar5);
      iVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
      if (iVar3 != 0xb) {
        __assert_fail("f.type() == expression_type::function",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                      ,0x3c,"void mjs::print_visitor::operator()(const object_literal_expression &)"
                     );
      }
      handle_function(this,(function_base *)(plVar2 + 4));
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

void operator()(const object_literal_expression& e) {
        os_ << '{';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            if (es[i].type() == property_assignment_type::normal) {
                os_ << (i ? ", " : "");
                accept(es[i].name(), *this);
                os_ << ": ";
                accept(es[i].value(), *this);
            } else {
                os_ << (i ? "," : "");
                const auto& f = es[i].value();
                assert(f.type() == expression_type::function);
                handle_function(static_cast<const function_expression&>(f));
            }
        }
        os_ << '}';
    }